

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_16549e0::LowBDConvolveScaleTest::RunOne(LowBDConvolveScaleTest *this,bool ref)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  uchar *puVar4;
  CONV_BUF_TYPE *pCVar5;
  byte in_SIL;
  long in_RDI;
  int dst_stride;
  int src_stride;
  uint8_t *dst;
  uint8_t *src;
  int in_stack_00010c24;
  int in_stack_00010c28;
  int in_stack_00010c2c;
  uint8_t *in_stack_00010c30;
  int in_stack_00010c3c;
  uint8_t *in_stack_00010c40;
  InterpFilterParams *in_stack_00010c50;
  InterpFilterParams *in_stack_00010c58;
  int in_stack_00010c60;
  int in_stack_00010c68;
  int in_stack_00010c70;
  int in_stack_00010c78;
  ConvolveParams *in_stack_00010c80;
  bool in_stack_ffffffffffffff9e;
  bool in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  puVar3 = TestImage<unsigned_char>::GetSrcData
                     ((TestImage<unsigned_char> *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9f,in_stack_ffffffffffffff9e);
  puVar4 = TestImage<unsigned_char>::GetDstData
                     ((TestImage<unsigned_char> *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9f,in_stack_ffffffffffffff9e);
  pCVar5 = TestImage<unsigned_char>::GetDst16Data
                     ((TestImage<unsigned_char> *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9f,in_stack_ffffffffffffff9e);
  *(CONV_BUF_TYPE **)(in_RDI + 0x48) = pCVar5;
  iVar1 = TestImage<unsigned_char>::src_stride(*(TestImage<unsigned_char> **)(in_RDI + 0x38));
  iVar2 = TestImage<unsigned_char>::dst_stride(*(TestImage<unsigned_char> **)(in_RDI + 0x38));
  if ((in_SIL & 1) == 0) {
    (**(code **)(in_RDI + 0x78))
              (puVar3,iVar1,puVar4,iVar2,*(undefined4 *)(in_RDI + 0x10),
               *(undefined4 *)(in_RDI + 0x14),*(undefined8 *)(in_RDI + 0x28),
               *(undefined8 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0x1c),0x10,
               *(undefined4 *)(in_RDI + 0x20),0x14,in_RDI + 0x40);
  }
  else {
    av1_convolve_2d_scale_c
              (in_stack_00010c40,in_stack_00010c3c,in_stack_00010c30,in_stack_00010c2c,
               in_stack_00010c28,in_stack_00010c24,in_stack_00010c50,in_stack_00010c58,
               in_stack_00010c60,in_stack_00010c68,in_stack_00010c70,in_stack_00010c78,
               in_stack_00010c80);
  }
  return;
}

Assistant:

void RunOne(bool ref) override {
    const uint8_t *src = image_->GetSrcData(ref, false);
    uint8_t *dst = image_->GetDstData(ref, false);
    convolve_params_.dst = image_->GetDst16Data(ref, false);
    const int src_stride = image_->src_stride();
    const int dst_stride = image_->dst_stride();
    if (ref) {
      av1_convolve_2d_scale_c(src, src_stride, dst, dst_stride, width_, height_,
                              filter_x_, filter_y_, subpel_x_, kXStepQn,
                              subpel_y_, kYStepQn, &convolve_params_);
    } else {
      tst_fun_(src, src_stride, dst, dst_stride, width_, height_, filter_x_,
               filter_y_, subpel_x_, kXStepQn, subpel_y_, kYStepQn,
               &convolve_params_);
    }
  }